

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::CleanUpInlineCaches<true>(FunctionBody *this)

{
  code *pcVar1;
  anon_class_16_2_3f4a2e36 fn;
  anon_class_16_2_3f4a2e36 fn_00;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  void ***pppvVar6;
  Type *pTVar7;
  FunctionCodeGenRuntimeData **ppFVar8;
  FunctionCodeGenRuntimeData *this_00;
  undefined4 *puVar9;
  ThreadContext *this_01;
  FunctionBodyPolymorphicInlineCache *pFVar10;
  ThreadContext *threadContext;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> local_90;
  Type runtimeData_1;
  uint i_2;
  Type *codeGenGetSetRuntimeData;
  FunctionCodeGenRuntimeData *runtimeData;
  ProfileId i_1;
  Type *codeGenRuntimeData;
  IsInstInlineCache *local_48;
  IsInstInlineCache *inlineCache_1;
  uint totalCacheCount;
  uint rootObjectStoreInlineCacheEnd;
  uint rootObjectLoadMethodInlineCacheEnd;
  uint rootObjectLoadInlineCacheEnd;
  RootObjectBase *rootObjectBase;
  InlineCache *inlineCache;
  uint local_18;
  uint plainInlineCacheEnd;
  uint i;
  uint unregisteredInlineCacheCount;
  FunctionBody *this_local;
  
  plainInlineCacheEnd = 0;
  _i = this;
  pppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void___
                       ((WriteBarrierPtr *)&this->inlineCaches);
  if (*pppvVar6 != (void **)0x0) {
    local_18 = 0;
    inlineCache._4_4_ = GetRootObjectLoadInlineCacheStart(this);
    for (; local_18 < inlineCache._4_4_; local_18 = local_18 + 1) {
      pppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void___
                           ((WriteBarrierPtr *)&this->inlineCaches);
      if ((*pppvVar6)[local_18] != (void *)0x0) {
        pppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void___
                             ((WriteBarrierPtr *)&this->inlineCaches);
        rootObjectBase = (RootObjectBase *)(*pppvVar6)[local_18];
        InlineCache::Clear((InlineCache *)rootObjectBase);
      }
    }
    _rootObjectLoadMethodInlineCacheEnd = GetRootObject(this);
    rootObjectStoreInlineCacheEnd = GetRootObjectLoadMethodInlineCacheStart(this);
    for (; local_18 < rootObjectStoreInlineCacheEnd; local_18 = local_18 + 1) {
      pppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void___
                           ((WriteBarrierPtr *)&this->inlineCaches);
      if ((*pppvVar6)[local_18] != (void *)0x0) {
        pppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void___
                             ((WriteBarrierPtr *)&this->inlineCaches);
        InlineCache::Clear((InlineCache *)(*pppvVar6)[local_18]);
      }
    }
    totalCacheCount = GetRootObjectStoreInlineCacheStart(this);
    for (; local_18 < totalCacheCount; local_18 = local_18 + 1) {
      pppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void___
                           ((WriteBarrierPtr *)&this->inlineCaches);
      if ((*pppvVar6)[local_18] != (void *)0x0) {
        pppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void___
                             ((WriteBarrierPtr *)&this->inlineCaches);
        InlineCache::Clear((InlineCache *)(*pppvVar6)[local_18]);
      }
    }
    inlineCache_1._4_4_ = GetInlineCacheCount(this);
    for (; local_18 < inlineCache_1._4_4_; local_18 = local_18 + 1) {
      pppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void___
                           ((WriteBarrierPtr *)&this->inlineCaches);
      if ((*pppvVar6)[local_18] != (void *)0x0) {
        pppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void___
                             ((WriteBarrierPtr *)&this->inlineCaches);
        InlineCache::Clear((InlineCache *)(*pppvVar6)[local_18]);
      }
    }
    uVar4 = GetInlineCacheCount(this);
    uVar5 = GetIsInstInlineCacheCount(this);
    inlineCache_1._0_4_ = uVar4 + uVar5;
    for (; local_18 < (uint)inlineCache_1; local_18 = local_18 + 1) {
      pppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void___
                           ((WriteBarrierPtr *)&this->inlineCaches);
      if ((*pppvVar6)[local_18] != (void *)0x0) {
        pppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void___
                             ((WriteBarrierPtr *)&this->inlineCaches);
        local_48 = (IsInstInlineCache *)(*pppvVar6)[local_18];
        IsInstInlineCache::Clear(local_48);
      }
    }
    codeGenRuntimeData = (Type *)0x0;
    Memory::WriteBarrierPtr<void_*>::operator=(&this->inlineCaches,&codeGenRuntimeData);
  }
  pTVar7 = GetCodeGenRuntimeData(this);
  if (pTVar7 != (Type *)0x0) {
    for (runtimeData._6_2_ = 0; runtimeData._6_2_ < this->profiledCallSiteCount;
        runtimeData._6_2_ = runtimeData._6_2_ + 1) {
      ppFVar8 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                          ((WriteBarrierPtr *)(pTVar7 + runtimeData._6_2_));
      if (*ppFVar8 != (FunctionCodeGenRuntimeData *)0x0) {
        fn_00.this = this;
        fn_00.unregisteredInlineCacheCount = &plainInlineCacheEnd;
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<true>()::_lambda(Js::InlineCache*)_1_>
                  (*ppFVar8,fn_00);
      }
    }
  }
  pTVar7 = GetCodeGenGetSetRuntimeData(this);
  if (pTVar7 != (Type *)0x0) {
    for (runtimeData_1.ptr._4_4_ = 0; uVar2 = runtimeData_1.ptr._4_4_,
        uVar4 = GetInlineCacheCount(this), uVar2 < uVar4;
        runtimeData_1.ptr._4_4_ = runtimeData_1.ptr._4_4_ + 1) {
      Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr
                (&local_90,pTVar7 + runtimeData_1.ptr._4_4_);
      ppFVar8 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                          ((WriteBarrierPtr *)&local_90);
      if (*ppFVar8 != (FunctionCodeGenRuntimeData *)0x0) {
        this_00 = Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::operator->(&local_90);
        fn.this = this;
        fn.unregisteredInlineCacheCount = &plainInlineCacheEnd;
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<true>()::_lambda(Js::InlineCache*)_2_>
                  (this_00,fn);
      }
    }
  }
  if (plainInlineCacheEnd != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1db7,"(!IsScriptContextShutdown)",
                                "Unregistration of inlineCache should only be done if this is not scriptContext shutdown."
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
    this_01 = ScriptContext::GetThreadContext
                        ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    ThreadContext::NotifyInlineCacheBatchUnregistered(this_01,plainInlineCacheEnd);
  }
  while (pFVar10 = GetPolymorphicInlineCachesHead(this),
        pFVar10 != (FunctionBodyPolymorphicInlineCache *)0x0) {
    pFVar10 = GetPolymorphicInlineCachesHead(this);
    FunctionBodyPolymorphicInlineCache::Finalize(pFVar10,true);
  }
  InlineCachePointerArray<Js::PolymorphicInlineCache>::Reset(&this->polymorphicInlineCaches);
  return;
}

Assistant:

void FunctionBody::CleanUpInlineCaches()
    {
        uint unregisteredInlineCacheCount = 0;

        if (nullptr != this->inlineCaches)
        {
            // Inline caches are in this order
            //      plain inline cache
            //      root object load inline cache
            //      root object store inline cache
            //      isInst inline cache
            // The inlineCacheCount includes all but isInst inline cache

            uint i = 0;
            uint plainInlineCacheEnd = GetRootObjectLoadInlineCacheStart();
            for (; i < plainInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    InlineCache* inlineCache = (InlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        if (inlineCache->RemoveFromInvalidationList())
                        {
                            unregisteredInlineCacheCount++;
                        }
                        AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            RootObjectBase * rootObjectBase = this->GetRootObject();
            uint rootObjectLoadInlineCacheEnd = GetRootObjectLoadMethodInlineCacheStart();
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectLoadMethodInlineCacheEnd = GetRootObjectStoreInlineCacheStart();
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), true, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectStoreInlineCacheEnd = this->GetInlineCacheCount();
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, true, IsScriptContextShutdown);
                    }
                }
            }

            uint totalCacheCount = GetInlineCacheCount() + GetIsInstInlineCacheCount();
            for (; i < totalCacheCount; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    IsInstInlineCache* inlineCache = (IsInstInlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        inlineCache->Unregister(this->m_scriptContext);
                        AllocatorDelete(CacheAllocator, this->m_scriptContext->GetIsInstInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            this->inlineCaches = nullptr;

        }

        auto codeGenRuntimeData = this->GetCodeGenRuntimeData();
        if (nullptr != codeGenRuntimeData)
        {
            for (ProfileId i = 0; i < this->profiledCallSiteCount; i++)
            {
                const FunctionCodeGenRuntimeData* runtimeData = codeGenRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        auto codeGenGetSetRuntimeData = this->GetCodeGenGetSetRuntimeData();
        if (codeGenGetSetRuntimeData != nullptr)
        {
            for (uint i = 0; i < this->GetInlineCacheCount(); i++)
            {
                auto runtimeData = codeGenGetSetRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        if (unregisteredInlineCacheCount > 0)
        {
            AssertMsg(!IsScriptContextShutdown, "Unregistration of inlineCache should only be done if this is not scriptContext shutdown.");
            ThreadContext* threadContext = this->m_scriptContext->GetThreadContext();
            threadContext->NotifyInlineCacheBatchUnregistered(unregisteredInlineCacheCount);
        }

        while (this->GetPolymorphicInlineCachesHead())
        {
            this->GetPolymorphicInlineCachesHead()->Finalize(IsScriptContextShutdown);
        }
        polymorphicInlineCaches.Reset();
    }